

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HammeringPattern.cpp
# Opt level: O1

AggressorAccessPattern * __thiscall
HammeringPattern::get_access_pattern_by_aggressor(HammeringPattern *this,Aggressor *agg)

{
  int iVar1;
  AggressorAccessPattern *pAVar2;
  AggressorAccessPattern *pAVar3;
  AggressorAccessPattern *pAVar4;
  AggressorAccessPattern *pAVar5;
  bool bVar6;
  string local_60;
  string local_40;
  
  pAVar2 = (this->agg_access_patterns).
           super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pAVar3 = (this->agg_access_patterns).
           super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar6 = pAVar2 == pAVar3;
  pAVar5 = pAVar2;
  if (!bVar6) {
    iVar1 = ((pAVar2->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>._M_impl.
             super__Vector_impl_data._M_start)->id;
    pAVar4 = pAVar2;
    while (pAVar5 = pAVar4, iVar1 != agg->id) {
      bVar6 = pAVar4 + 1 == pAVar3;
      pAVar5 = pAVar2;
      if (bVar6) break;
      iVar1 = (pAVar4[1].aggressors.super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
               _M_impl.super__Vector_impl_data._M_start)->id;
      pAVar4 = pAVar4 + 1;
    }
  }
  if (bVar6) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "Could not find AggressorAccessPattern whose first aggressor has id %s.","");
    format_string<int>(&local_60,&local_40,agg->id);
    Logger::log_error(&local_60,true);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    exit(1);
  }
  return pAVar5;
}

Assistant:

AggressorAccessPattern &HammeringPattern::get_access_pattern_by_aggressor(Aggressor &agg) {
  // iterate over the AggressorAccessPatterns and return the *first* AggressorAccessPattern that has the given Aggressor
  // agg as its *first* Aggressor
  for (auto &aap : agg_access_patterns) {
    if (aap.aggressors[0].id==agg.id) return aap;
  }
  Logger::log_error(format_string("Could not find AggressorAccessPattern whose first aggressor has id %s.", agg.id));
  exit(1);
}